

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

void GD::save_load(gd *g,io_buf *model_file,bool read,bool text)

{
  float value;
  vw *all;
  bool bVar1;
  ostream *poVar2;
  undefined7 in_register_00000011;
  bool resume;
  pair<float,_float> p;
  ostream local_1a8;
  
  all = g->all;
  if ((int)CONCAT71(in_register_00000011,read) != 0) {
    initialize_regressor(all);
    if ((all->adaptive == true) && (0.0 < all->initial_t)) {
      p.second = all->initial_t;
      p.first = all->initial_weight;
      if ((all->weights).sparse == true) {
        sparse_parameters::
        set_default<std::pair<float,float>,GD::set_initial_gd_wrapper<sparse_parameters>>
                  (&(all->weights).sparse_weights,&p);
      }
      else {
        dense_parameters::
        set_default<std::pair<float,float>,GD::set_initial_gd_wrapper<dense_parameters>>
                  (&(all->weights).dense_weights,&p);
      }
    }
    value = g->initial_constant;
    if ((value != 0.0) || (NAN(value))) {
      VW::set_weight(all,0xb1c55c,0,value);
    }
  }
  if ((model_file->files)._end != (model_file->files)._begin) {
    resume = all->save_resume;
    std::__cxx11::stringstream::stringstream((stringstream *)&p);
    poVar2 = std::operator<<(&local_1a8,":");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::operator<<(poVar2,"\n");
    bin_text_read_write_fixed(model_file,&resume,1,"",read,(stringstream *)&p,text);
    if (resume == true) {
      if (read) {
        bVar1 = version_struct::operator<(&all->model_file_ver,"7.10.1");
        if (bVar1) {
          poVar2 = std::endl<char,std::char_traits<char>>(&(all->trace_message).super_ostream);
          poVar2 = std::operator<<(poVar2,
                                   "WARNING: --save_resume functionality is known to have inaccuracy in model files version less than "
                                  );
          poVar2 = std::operator<<(poVar2,"7.10.1");
          poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
          std::endl<char,std::char_traits<char>>(poVar2);
        }
      }
      save_load_online_state(all,model_file,read,text,g);
    }
    else {
      save_load_regressor(all,model_file,read,text);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&p);
  }
  if (all->training == false) {
    sync_weights(all);
  }
  return;
}

Assistant:

void save_load(gd& g, io_buf& model_file, bool read, bool text)
{
  vw& all = *g.all;
  if (read)
  {
    initialize_regressor(all);

    if (all.adaptive && all.initial_t > 0)
    {
      float init_weight = all.initial_weight;
      pair<float, float> p = make_pair(init_weight, all.initial_t);
      if (all.weights.sparse)
        all.weights.sparse_weights.set_default<pair<float, float>, set_initial_gd_wrapper<sparse_parameters> >(p);
      else
        all.weights.dense_weights.set_default<pair<float, float>, set_initial_gd_wrapper<dense_parameters> >(p);
      // for adaptive update, we interpret initial_t as previously seeing initial_t fake datapoints, all with squared
      // gradient=1 NOTE: this is not invariant to the scaling of the data (i.e. when combined with normalized). Since
      // scaling the data scales the gradient, this should ideally be feature_range*initial_t, or something like that.
      // We could potentially fix this by just adding this base quantity times the current range to the sum of gradients
      // stored in memory at each update, and always start sum of gradients to 0, at the price of additional additions
      // and multiplications during the update...
    }
    if (g.initial_constant != 0.0)
      VW::set_weight(all, constant, 0, g.initial_constant);
  }

  if (model_file.files.size() > 0)
  {
    bool resume = all.save_resume;
    stringstream msg;
    msg << ":" << resume << "\n";
    bin_text_read_write_fixed(model_file, (char*)&resume, sizeof(resume), "", read, msg, text);
    if (resume)
    {
      if (read && all.model_file_ver < VERSION_SAVE_RESUME_FIX)
        all.trace_message
            << endl
            << "WARNING: --save_resume functionality is known to have inaccuracy in model files version less than "
            << VERSION_SAVE_RESUME_FIX << endl
            << endl;
      // save_load_online_state(g, model_file, read, text);
      save_load_online_state(all, model_file, read, text, &g);
    }
    else
      save_load_regressor(all, model_file, read, text);
  }
  if (!all.training)  // If the regressor was saved as --save_resume, then when testing we want to materialize the
                      // weights.
    sync_weights(all);
}